

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void create_new_bb_insns(gen_ctx_t gen_ctx,MIR_insn_t before,MIR_insn_t after,MIR_insn_t insn_for_bb
                        )

{
  bb_insn_t_conflict pbVar1;
  bb_insn_t_conflict elem;
  bb_insn_t_conflict local_60;
  bb_insn_t_conflict local_58;
  bb_t_conflict local_50;
  bb_t_conflict bb;
  bb_insn_t_conflict new_bb_insn;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t insn;
  MIR_insn_t insn_for_bb_local;
  MIR_insn_t after_local;
  MIR_insn_t before_local;
  gen_ctx_t gen_ctx_local;
  
  if (insn_for_bb == (MIR_insn_t)0x0) {
    local_50 = DLIST_bb_t_el(&gen_ctx->curr_cfg->bbs,2);
  }
  else {
    local_50 = get_insn_bb(gen_ctx,insn_for_bb);
  }
  if (gen_ctx->optimize_level == 0) {
    if (before == (MIR_insn_t)0x0) {
      local_58 = (bb_insn_t_conflict)
                 DLIST_MIR_insn_t_head(&((gen_ctx->curr_func_item->u).func)->insns);
    }
    else {
      local_58 = (bb_insn_t_conflict)DLIST_MIR_insn_t_next(before);
    }
    for (bb_insn = local_58; bb_insn != (bb_insn_t_conflict)after;
        bb_insn = (bb_insn_t_conflict)DLIST_MIR_insn_t_next((MIR_insn_t)bb_insn)) {
      setup_insn_data(gen_ctx,(MIR_insn_t)bb_insn,local_50);
    }
  }
  else if ((before == (MIR_insn_t)0x0) ||
          (new_bb_insn = (bb_insn_t_conflict)before->data, new_bb_insn->bb != local_50)) {
    if (after == (MIR_insn_t)0x0) {
      __assert_fail("after != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x295,"void create_new_bb_insns(gen_ctx_t, MIR_insn_t, MIR_insn_t, MIR_insn_t)"
                   );
    }
    pbVar1 = (bb_insn_t_conflict)after->data;
    if (before == (MIR_insn_t)0x0) {
      local_60 = (bb_insn_t_conflict)
                 DLIST_MIR_insn_t_head(&((gen_ctx->curr_func_item->u).func)->insns);
    }
    else {
      local_60 = (bb_insn_t_conflict)DLIST_MIR_insn_t_next(before);
    }
    for (bb_insn = local_60; bb_insn != (bb_insn_t_conflict)after;
        bb_insn = (bb_insn_t_conflict)DLIST_MIR_insn_t_next((MIR_insn_t)bb_insn)) {
      elem = create_bb_insn(gen_ctx,(MIR_insn_t)bb_insn,local_50);
      if (local_50 == pbVar1->bb) {
        DLIST_bb_insn_t_insert_before(&local_50->bb_insns,pbVar1,elem);
      }
      else {
        DLIST_bb_insn_t_append(&local_50->bb_insns,elem);
      }
    }
  }
  else {
    bb_insn = (bb_insn_t_conflict)DLIST_MIR_insn_t_next(before);
    while (bb_insn != (bb_insn_t_conflict)after) {
      pbVar1 = create_bb_insn(gen_ctx,(MIR_insn_t)bb_insn,local_50);
      DLIST_bb_insn_t_insert_after(&local_50->bb_insns,new_bb_insn,pbVar1);
      bb_insn = (bb_insn_t_conflict)DLIST_MIR_insn_t_next((MIR_insn_t)bb_insn);
      new_bb_insn = pbVar1;
    }
  }
  return;
}

Assistant:

static void create_new_bb_insns (gen_ctx_t gen_ctx, MIR_insn_t before, MIR_insn_t after,
                                 MIR_insn_t insn_for_bb) {
  MIR_insn_t insn;
  bb_insn_t bb_insn, new_bb_insn;
  bb_t bb;

  /* Null insn_for_bb means it should be in the 1st block: skip entry and exit blocks: */
  bb = insn_for_bb == NULL ? DLIST_EL (bb_t, curr_cfg->bbs, 2) : get_insn_bb (gen_ctx, insn_for_bb);
  if (optimize_level == 0) {
    for (insn = (before == NULL ? DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns)
                                : DLIST_NEXT (MIR_insn_t, before));
         insn != after; insn = DLIST_NEXT (MIR_insn_t, insn))
      setup_insn_data (gen_ctx, insn, bb);
    return;
  }
  if (before != NULL && (bb_insn = before->data)->bb == bb) {
    for (insn = DLIST_NEXT (MIR_insn_t, before); insn != after;
         insn = DLIST_NEXT (MIR_insn_t, insn), bb_insn = new_bb_insn) {
      new_bb_insn = create_bb_insn (gen_ctx, insn, bb);
      DLIST_INSERT_AFTER (bb_insn_t, bb->bb_insns, bb_insn, new_bb_insn);
    }
  } else {
    gen_assert (after != NULL);
    bb_insn = after->data;
    insn = (before == NULL ? DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns)
                           : DLIST_NEXT (MIR_insn_t, before));
    for (; insn != after; insn = DLIST_NEXT (MIR_insn_t, insn)) {
      new_bb_insn = create_bb_insn (gen_ctx, insn, bb);
      if (bb == bb_insn->bb)
        DLIST_INSERT_BEFORE (bb_insn_t, bb->bb_insns, bb_insn, new_bb_insn);
      else
        DLIST_APPEND (bb_insn_t, bb->bb_insns, new_bb_insn);
    }
  }
}